

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O2

void __thiscall
NLStringRefTest_ConstructFromCStringAndSize_Test::TestBody
          (NLStringRefTest_ConstructFromCStringAndSize_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_78;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar;
  NLStringRef s;
  char *data;
  NLStringRef local_28;
  
  data = "foo";
  mp::NLStringRef::NLStringRef(&s,"foo",7);
  gtest_ar_2._0_8_ = s.data_;
  testing::internal::CmpHelperEQ<char_const*,char_const*>
            ((internal *)&gtest_ar,"data","s.c_str()",&data,(char **)&gtest_ar_2);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
               0x53,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_78.data_._0_4_ = 7;
  gtest_ar_2._0_8_ = s.size_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&gtest_ar,"7u","s.size()",(uint *)&local_78,(unsigned_long *)&gtest_ar_2);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
               0x54,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar_2.success_ == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gtest_ar,"string not null-terminated",(allocator<char> *)&local_78);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::NLStringRef::NLStringRef(&local_28,"foo",2);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar_2,
               (char (*) [111])
               "Expected: mp::NLStringRef(\"foo\", 2) throws an exception of type AssertionFailure.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_ar);
  }
  testing::Message::Message((Message *)&gtest_ar);
  if (gtest_ar_2.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_78,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x55,pcVar2);
  testing::internal::AssertHelper::operator=(&local_78,(Message *)&gtest_ar);
  testing::internal::AssertHelper::~AssertHelper(&local_78);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  return;
}

Assistant:

TEST(NLStringRefTest, ConstructFromCStringAndSize) {
  const char *data = "foo\0bar";
  const mp::NLStringRef s(data, 7);
  EXPECT_EQ(data, s.c_str());
  EXPECT_EQ(7u, s.size());
  EXPECT_ASSERT(mp::NLStringRef("foo", 2), "string not null-terminated");
}